

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

bool __thiscall cashew::JSPrinter::isNothing(JSPrinter *this,Ref node)

{
  bool bVar1;
  Ref *pRVar2;
  bool bVar3;
  Ref local_18;
  Ref node_local;
  
  if ((node.inst)->type == Array) {
    bVar3 = false;
    local_18.inst = node.inst;
    pRVar2 = Ref::operator[](&local_18,0);
    bVar1 = Ref::operator==(pRVar2,(IString *)&TOPLEVEL);
    if (bVar1) {
      pRVar2 = Ref::operator[](&local_18,1);
      if (pRVar2->inst->type != Array) {
        __assert_fail("isArray()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                      ,0x199,"size_t cashew::Value::size()");
      }
      bVar3 = (((pRVar2->inst->field_1).arr)->
              super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements == 0;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool isNothing(Ref node) {
    return node->isArray() && node[0] == TOPLEVEL && node[1]->size() == 0;
  }